

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void dlib::
     isort_array<std::__cxx11::string[29],dlib::open_file_box_helper::case_insensitive_compare>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> (*array) [29],
               unsigned_long left,unsigned_long right,case_insensitive_compare *comp)

{
  bool bVar1;
  string *psVar2;
  string *b;
  long lVar3;
  long lVar4;
  
  psVar2 = *array + left;
  lVar4 = -1;
  do {
    left = left + 1;
    b = psVar2;
    lVar3 = lVar4;
    if (right < left) {
      return;
    }
    do {
      bVar1 = open_file_box_helper::case_insensitive_compare::operator()(comp,b + 1,b);
      if (!bVar1) break;
      std::__cxx11::string::swap((string *)(b + 1));
      b = b + -1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
    psVar2 = psVar2 + 1;
    lVar4 = lVar4 + -1;
  } while( true );
}

Assistant:

void isort_array (
        T& array,
        const unsigned long left,
        const unsigned long right,
        const compare& comp
    )
    {
        DLIB_ASSERT (left <= right,
                "\tvoid isort_array()"
                << "\n\tleft:          " << left
                << "\n\tright:         " << right );
        using namespace sort_helpers;

        unsigned long pos;
        for (unsigned long i = left+1; i <= right; ++i)
        {
            // everything from left to i-1 is sorted.
            pos = i;
            for (unsigned long j = i-1; comp(array[pos] , array[j]); --j)
            {
                exchange(array[pos],array[j]);
                pos = j;
                
                if (j == left)
                    break;
            }
        }
    }